

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::ContinuousAssignSymbol::fromSyntax
               (Compilation *compilation,ContinuousAssignSyntax *syntax,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *this;
  basic_string_view<char,_std::char_traits<char>_> *args;
  long in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  string_view sVar2;
  ContinuousAssignSymbol *symbol;
  IdentifierNameSyntax *ins;
  iterator __end5;
  iterator __begin5;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *__range5;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  ExpressionSyntax *expr;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  NetType *netType;
  ASTContext context;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbb8;
  ContinuousAssignSymbol *in_stack_fffffffffffffbc0;
  Scope *in_stack_fffffffffffffbc8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffbd0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbd8;
  NetSymbol *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  NetType *in_stack_fffffffffffffbf0;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffbf8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc00;
  undefined1 *puVar3;
  undefined1 *hash_00;
  string_view local_330;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_320;
  IdentifierNameSyntax *local_308;
  iterator local_300;
  iterator local_2f8;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *local_2f0;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_2e8 [2];
  SyntaxNode *local_2a8;
  const_iterator local_2a0;
  const_iterator local_280;
  long local_270;
  undefined1 local_1e0 [56];
  NetType *local_1a8;
  bitmask<slang::ast::ASTFlags> local_1a0 [8];
  basic_string_view<char,_std::char_traits<char>_> *local_160;
  long local_148;
  string_view *local_138;
  undefined1 *local_130;
  string_view *local_128;
  undefined1 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  size_t local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_78;
  string_view *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_10;
  undefined1 *local_8;
  
  local_160 = in_R8;
  local_148 = in_RSI;
  bitmask<slang::ast::ASTFlags>::bitmask(local_1a0,NonProcedural);
  ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x7215d3);
  local_1a8 = Scope::getDefaultNetType(in_stack_fffffffffffffbc8);
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              *)in_stack_fffffffffffffbd0.m_bits);
  local_270 = local_148 + 0x70;
  local_280 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x721611);
  local_2a0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x721650);
  do {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffbc0,
                       (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                       in_stack_fffffffffffffbb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                   *)0x721e3e);
      return;
    }
    local_2a8 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                              *)0x7216bf)->super_SyntaxNode;
    bVar1 = NetType::isError(local_1a8);
    if ((!bVar1) && (((SyntaxNode *)&local_2a8->kind)->kind == AssignmentExpression)) {
      SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL>::SmallVector
                ((SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *)0x72171e);
      slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(local_2a8);
      not_null<slang::syntax::ExpressionSyntax_*>::operator*
                ((not_null<slang::syntax::ExpressionSyntax_*> *)0x721746);
      Expression::findPotentiallyImplicitNets
                ((SyntaxNode *)in_stack_fffffffffffffbd0.m_bits,
                 (ASTContext *)in_stack_fffffffffffffbc8,
                 (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)
                 in_stack_fffffffffffffbc0);
      local_2f0 = local_2e8;
      local_2f8 = SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::begin(local_2f0);
      local_300 = SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::end(local_2f0);
      for (; local_2f8 != local_300; local_2f8 = local_2f8 + 1) {
        local_308 = *local_2f8;
        puVar3 = local_1e0;
        sVar2 = parsing::Token::valueText((Token *)in_stack_fffffffffffffbd0.m_bits);
        local_138 = &local_330;
        local_130 = puVar3;
        local_128 = local_138;
        local_120 = puVar3;
        local_70 = local_138;
        local_68 = puVar3;
        local_330 = sVar2;
        this = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                  ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                            ((basic_string_view<char,_std::char_traits<char>_> *)0x72189f);
        local_78 = this;
        args = (basic_string_view<char,_std::char_traits<char>_> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                           *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        local_80 = args;
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                                   *)in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8);
        local_10 = local_78;
        local_20 = local_80;
        hash_00 = puVar3;
        local_18 = local_88;
        local_8 = puVar3;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_88);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                               *)0x721981);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                       ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                                   *)0x7219da);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffbf0 =
                   (NetType *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                           *)0x721a2a);
              in_stack_fffffffffffffbf8 = local_10;
              in_stack_fffffffffffffc00._M_extent_value =
                   (size_t)boost::unordered::detail::foa::
                           table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                           ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                     ((basic_string_view<char,_std::char_traits<char>_> *)0x721a57);
              bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffbd0.m_bits);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                goto LAB_00721b5e;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_fffffffffffffbef =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8);
          if ((bool)in_stack_fffffffffffffbef) {
            memset(&local_a0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_a0);
            goto LAB_00721b5e;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(puVar3 + 0x10));
        } while (bVar1);
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_a0);
LAB_00721b5e:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_a0);
        if (bVar1) {
          local_b0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::make_iterator((locator *)0x721b80);
          local_b1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_320,&local_b0,&local_b1);
        }
        else if (*(ulong *)(hash_00 + 0x30) < *(ulong *)(hash_00 + 0x28)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                    ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8,
                     in_stack_fffffffffffffbd0.m_bits,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbc8);
          local_c8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::make_iterator((locator *)0x721c02);
          local_e1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_320,&local_c8,local_e1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                    (this,(size_t)hash_00,args);
          local_f8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::make_iterator((locator *)0x721c6a);
          local_111[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_320,&local_f8,local_111);
        }
        if ((local_320.second & 1U) != 0) {
          in_stack_fffffffffffffbd8 = local_160;
          in_stack_fffffffffffffbe0 =
               NetSymbol::createImplicit
                         ((Compilation *)in_stack_fffffffffffffc00._M_extent_value,
                          (IdentifierNameSyntax *)in_stack_fffffffffffffbf8,
                          in_stack_fffffffffffffbf0);
          SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffbc0,
                     (Symbol **)in_stack_fffffffffffffbb8);
        }
      }
      SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *)0x721d6e);
    }
    in_stack_fffffffffffffbc0 =
         BumpAllocator::
         emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
                   ((BumpAllocator *)in_stack_fffffffffffffbc0,
                    (ExpressionSyntax *)in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffbd0.m_bits = (underlying_type)in_stack_fffffffffffffbc0;
    in_stack_fffffffffffffbc8 =
         not_null<const_slang::ast::Scope_*>::operator*
                   ((not_null<const_slang::ast::Scope_*> *)0x721db3);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffbd0.m_bits,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffbc8);
    syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffc00._M_extent_value;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffbf8;
    Symbol::setAttributes
              (&in_stack_fffffffffffffbf0->super_Symbol,
               (Scope *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),syntax_00);
    SmallVectorBase<const_slang::ast::Symbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffbc0,
               (Symbol **)in_stack_fffffffffffffbb8);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffbc0);
  } while( true );
}

Assistant:

void ContinuousAssignSymbol::fromSyntax(Compilation& compilation,
                                        const ContinuousAssignSyntax& syntax,
                                        const ASTContext& parentContext,
                                        SmallVectorBase<const Symbol*>& results,
                                        SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();
    SmallSet<std::string_view, 8> seenNames;

    for (auto expr : syntax.assignments) {
        // If not explicitly disabled, check for net references on the lhs of each
        // assignment that should create implicit nets.
        if (!netType.isError()) {
            // The expression here should always be an assignment expression unless
            // the program is already ill-formed (diagnosed by the parser).
            if (expr->kind == SyntaxKind::AssignmentExpression) {
                SmallVector<const IdentifierNameSyntax*> implicitNetNames;
                Expression::findPotentiallyImplicitNets(*expr->as<BinaryExpressionSyntax>().left,
                                                        context, implicitNetNames);

                for (auto ins : implicitNetNames) {
                    if (seenNames.emplace(ins->identifier.valueText()).second) {
                        implicitNets.push_back(
                            &NetSymbol::createImplicit(compilation, *ins, netType));
                    }
                }
            }
        }

        auto symbol = compilation.emplace<ContinuousAssignSymbol>(*expr);
        symbol->setAttributes(*context.scope, syntax.attributes);
        results.push_back(symbol);
    }
}